

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

void __thiscall grib2dec_demo::Output::Output(Output *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  
  this->_vptr_Output = (_func_int **)&PTR___cxa_pure_virtual_00105c80;
  if (filename->_M_string_length != 0) {
    iVar1 = std::__cxx11::string::compare((char *)filename);
    if (iVar1 != 0) {
      poVar2 = (ostream *)&this->fileOut;
      goto LAB_00102ce5;
    }
  }
  poVar2 = (ostream *)&std::cout;
LAB_00102ce5:
  this->out = poVar2;
  std::ofstream::ofstream(&this->fileOut);
  if (filename->_M_string_length != 0) {
    iVar1 = std::__cxx11::string::compare((char *)filename);
    if (iVar1 != 0) {
      std::ofstream::open((string *)&this->fileOut,(_Ios_Openmode)filename);
    }
  }
  return;
}

Assistant:

Output::Output(const string& filename)
    : out(filename.empty() || filename == "-" ? cout : fileOut)
{
    if (!filename.empty() && filename != "-")
        fileOut.open(filename);
}